

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_memory_object(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_memory_object != 0) {
    glad_glGetUnsignedBytevEXT = (PFNGLGETUNSIGNEDBYTEVEXTPROC)(*load)("glGetUnsignedBytevEXT");
    glad_glGetUnsignedBytei_vEXT =
         (PFNGLGETUNSIGNEDBYTEI_VEXTPROC)(*load)("glGetUnsignedBytei_vEXT");
    glad_glDeleteMemoryObjectsEXT =
         (PFNGLDELETEMEMORYOBJECTSEXTPROC)(*load)("glDeleteMemoryObjectsEXT");
    glad_glIsMemoryObjectEXT = (PFNGLISMEMORYOBJECTEXTPROC)(*load)("glIsMemoryObjectEXT");
    glad_glCreateMemoryObjectsEXT =
         (PFNGLCREATEMEMORYOBJECTSEXTPROC)(*load)("glCreateMemoryObjectsEXT");
    glad_glMemoryObjectParameterivEXT =
         (PFNGLMEMORYOBJECTPARAMETERIVEXTPROC)(*load)("glMemoryObjectParameterivEXT");
    glad_glGetMemoryObjectParameterivEXT =
         (PFNGLGETMEMORYOBJECTPARAMETERIVEXTPROC)(*load)("glGetMemoryObjectParameterivEXT");
    glad_glTexStorageMem2DEXT = (PFNGLTEXSTORAGEMEM2DEXTPROC)(*load)("glTexStorageMem2DEXT");
    glad_glTexStorageMem2DMultisampleEXT =
         (PFNGLTEXSTORAGEMEM2DMULTISAMPLEEXTPROC)(*load)("glTexStorageMem2DMultisampleEXT");
    glad_glTexStorageMem3DEXT = (PFNGLTEXSTORAGEMEM3DEXTPROC)(*load)("glTexStorageMem3DEXT");
    glad_glTexStorageMem3DMultisampleEXT =
         (PFNGLTEXSTORAGEMEM3DMULTISAMPLEEXTPROC)(*load)("glTexStorageMem3DMultisampleEXT");
    glad_glBufferStorageMemEXT = (PFNGLBUFFERSTORAGEMEMEXTPROC)(*load)("glBufferStorageMemEXT");
    glad_glTextureStorageMem2DEXT =
         (PFNGLTEXTURESTORAGEMEM2DEXTPROC)(*load)("glTextureStorageMem2DEXT");
    glad_glTextureStorageMem2DMultisampleEXT =
         (PFNGLTEXTURESTORAGEMEM2DMULTISAMPLEEXTPROC)(*load)("glTextureStorageMem2DMultisampleEXT");
    glad_glTextureStorageMem3DEXT =
         (PFNGLTEXTURESTORAGEMEM3DEXTPROC)(*load)("glTextureStorageMem3DEXT");
    glad_glTextureStorageMem3DMultisampleEXT =
         (PFNGLTEXTURESTORAGEMEM3DMULTISAMPLEEXTPROC)(*load)("glTextureStorageMem3DMultisampleEXT");
    glad_glNamedBufferStorageMemEXT =
         (PFNGLNAMEDBUFFERSTORAGEMEMEXTPROC)(*load)("glNamedBufferStorageMemEXT");
    glad_glTexStorageMem1DEXT = (PFNGLTEXSTORAGEMEM1DEXTPROC)(*load)("glTexStorageMem1DEXT");
    glad_glTextureStorageMem1DEXT =
         (PFNGLTEXTURESTORAGEMEM1DEXTPROC)(*load)("glTextureStorageMem1DEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_memory_object(GLADloadproc load) {
	if(!GLAD_GL_EXT_memory_object) return;
	glad_glGetUnsignedBytevEXT = (PFNGLGETUNSIGNEDBYTEVEXTPROC)load("glGetUnsignedBytevEXT");
	glad_glGetUnsignedBytei_vEXT = (PFNGLGETUNSIGNEDBYTEI_VEXTPROC)load("glGetUnsignedBytei_vEXT");
	glad_glDeleteMemoryObjectsEXT = (PFNGLDELETEMEMORYOBJECTSEXTPROC)load("glDeleteMemoryObjectsEXT");
	glad_glIsMemoryObjectEXT = (PFNGLISMEMORYOBJECTEXTPROC)load("glIsMemoryObjectEXT");
	glad_glCreateMemoryObjectsEXT = (PFNGLCREATEMEMORYOBJECTSEXTPROC)load("glCreateMemoryObjectsEXT");
	glad_glMemoryObjectParameterivEXT = (PFNGLMEMORYOBJECTPARAMETERIVEXTPROC)load("glMemoryObjectParameterivEXT");
	glad_glGetMemoryObjectParameterivEXT = (PFNGLGETMEMORYOBJECTPARAMETERIVEXTPROC)load("glGetMemoryObjectParameterivEXT");
	glad_glTexStorageMem2DEXT = (PFNGLTEXSTORAGEMEM2DEXTPROC)load("glTexStorageMem2DEXT");
	glad_glTexStorageMem2DMultisampleEXT = (PFNGLTEXSTORAGEMEM2DMULTISAMPLEEXTPROC)load("glTexStorageMem2DMultisampleEXT");
	glad_glTexStorageMem3DEXT = (PFNGLTEXSTORAGEMEM3DEXTPROC)load("glTexStorageMem3DEXT");
	glad_glTexStorageMem3DMultisampleEXT = (PFNGLTEXSTORAGEMEM3DMULTISAMPLEEXTPROC)load("glTexStorageMem3DMultisampleEXT");
	glad_glBufferStorageMemEXT = (PFNGLBUFFERSTORAGEMEMEXTPROC)load("glBufferStorageMemEXT");
	glad_glTextureStorageMem2DEXT = (PFNGLTEXTURESTORAGEMEM2DEXTPROC)load("glTextureStorageMem2DEXT");
	glad_glTextureStorageMem2DMultisampleEXT = (PFNGLTEXTURESTORAGEMEM2DMULTISAMPLEEXTPROC)load("glTextureStorageMem2DMultisampleEXT");
	glad_glTextureStorageMem3DEXT = (PFNGLTEXTURESTORAGEMEM3DEXTPROC)load("glTextureStorageMem3DEXT");
	glad_glTextureStorageMem3DMultisampleEXT = (PFNGLTEXTURESTORAGEMEM3DMULTISAMPLEEXTPROC)load("glTextureStorageMem3DMultisampleEXT");
	glad_glNamedBufferStorageMemEXT = (PFNGLNAMEDBUFFERSTORAGEMEMEXTPROC)load("glNamedBufferStorageMemEXT");
	glad_glTexStorageMem1DEXT = (PFNGLTEXSTORAGEMEM1DEXTPROC)load("glTexStorageMem1DEXT");
	glad_glTextureStorageMem1DEXT = (PFNGLTEXTURESTORAGEMEM1DEXTPROC)load("glTextureStorageMem1DEXT");
}